

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O2

bool __thiscall
Saturation::PredicateSplitPassiveClauseContainer::exceedsWeightLimit
          (PredicateSplitPassiveClauseContainer *this,uint w,uint numPositiveLiterals,
          Inference *inference)

{
  pointer puVar1;
  __uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  _Var2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  float featureValue;
  
  (*(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
    _vptr_ClauseContainer[0x15])(this,(ulong)numPositiveLiterals,inference);
  uVar4 = bestQueue(this,featureValue);
  do {
    uVar5 = (ulong)uVar4;
    puVar1 = (this->_queues).
             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->_queues).
                  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (uVar6 <= uVar5) break;
    _Var2._M_t.
    super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
    .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
         puVar1[uVar5]._M_t.
         super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
         ._M_t;
    cVar3 = (**(code **)(*(long *)_Var2._M_t.
                                  super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                  .
                                  super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                  ._M_head_impl + 0x88))
                      (_Var2._M_t.
                       super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                       .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                       _M_head_impl,w,numPositiveLiterals,inference);
    uVar4 = uVar4 + 1;
  } while (cVar3 != '\0');
  return uVar6 <= uVar5;
}

Assistant:

bool PredicateSplitPassiveClauseContainer::exceedsWeightLimit(unsigned w, unsigned numPositiveLiterals, const Inference& inference) const
{
  auto bestQueueIndex = bestQueue(evaluateFeatureEstimate(numPositiveLiterals, inference));
  // note: even for non-layered-arrangements, we need to go through all queues, since the values for age, w, ... are only lower bounds (in the sense that the actual value could lead to a worse bestQueueIndex)
  for (unsigned i = bestQueueIndex; i < _queues.size(); i++)
  {
    auto& queue = _queues[i];
    if (!queue->exceedsWeightLimit(w, numPositiveLiterals, inference))
    {
      return false;
    }
  }
  return true;
}